

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::undoIterateBackwards<double>
          (HighsPostsolveStack *this,vector<double,_std::allocator<double>_> *values,
          vector<int,_std::allocator<int>_> *index,HighsInt origSize)

{
  value_type vVar1;
  reference pvVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  size_t i;
  undefined8 local_28;
  vector<double,_std::allocator<double>_> *pvVar4;
  
  std::vector<double,_std::allocator<double>_>::resize(in_RSI,(size_type)in_RDX);
  local_28 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
  for (; local_28 != 0; local_28 = local_28 - 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,local_28 - 1);
    vVar1 = *pvVar2;
    pvVar4 = in_RSI;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,local_28 - 1);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)*pvVar3);
    *pvVar2 = vVar1;
    in_RSI = pvVar4;
  }
  return;
}

Assistant:

void undoIterateBackwards(std::vector<T>& values,
                            const std::vector<HighsInt>& index,
                            HighsInt origSize) {
    values.resize(origSize);
#ifdef DEBUG_EXTRA
    // Fill vector with NaN for debugging purposes
    std::vector<T> valuesNew;
    valuesNew.resize(origSize, std::numeric_limits<T>::signaling_NaN());
    for (size_t i = index.size(); i > 0; --i) {
      assert(static_cast<size_t>(index[i - 1]) >= i - 1);
      valuesNew[index[i - 1]] = values[i - 1];
    }
    std::copy(valuesNew.cbegin(), valuesNew.cend(), values.begin());
#else
    for (size_t i = index.size(); i > 0; --i) {
      assert(static_cast<size_t>(index[i - 1]) >= i - 1);
      values[index[i - 1]] = values[i - 1];
    }
#endif
  }